

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O2

xmlRelaxNGContentType xmlRelaxNGMaxContentType(xmlRelaxNGContentType ct1,xmlRelaxNGContentType ct2)

{
  xmlRelaxNGContentType xVar1;
  
  if (ct2 == XML_RELAXNG_CONTENT_ERROR || ct1 == XML_RELAXNG_CONTENT_ERROR) {
    xVar1 = XML_RELAXNG_CONTENT_ERROR;
  }
  else {
    if (ct2 != XML_RELAXNG_CONTENT_SIMPLE && ct1 != XML_RELAXNG_CONTENT_SIMPLE) {
      return (uint)(ct2 == XML_RELAXNG_CONTENT_COMPLEX || ct1 == XML_RELAXNG_CONTENT_COMPLEX) * 2;
    }
    xVar1 = XML_RELAXNG_CONTENT_SIMPLE;
  }
  return xVar1;
}

Assistant:

static xmlRelaxNGContentType
xmlRelaxNGMaxContentType(xmlRelaxNGContentType ct1,
                         xmlRelaxNGContentType ct2)
{
    if ((ct1 == XML_RELAXNG_CONTENT_ERROR) ||
        (ct2 == XML_RELAXNG_CONTENT_ERROR))
        return (XML_RELAXNG_CONTENT_ERROR);
    if ((ct1 == XML_RELAXNG_CONTENT_SIMPLE) ||
        (ct2 == XML_RELAXNG_CONTENT_SIMPLE))
        return (XML_RELAXNG_CONTENT_SIMPLE);
    if ((ct1 == XML_RELAXNG_CONTENT_COMPLEX) ||
        (ct2 == XML_RELAXNG_CONTENT_COMPLEX))
        return (XML_RELAXNG_CONTENT_COMPLEX);
    return (XML_RELAXNG_CONTENT_EMPTY);
}